

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O1

Tile mercatortile::quadkey_to_tile(string *qk)

{
  ulong uVar1;
  undefined8 *puVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  Tile TVar8;
  
  uVar4 = (uint)qk->_M_string_length;
  if (uVar4 == 0) {
    uVar4 = 0;
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    if (0 < (int)uVar4) {
      lVar5 = (ulong)(uVar4 & 0x7fffffff) + 1;
      bVar3 = 0;
      uVar6 = 0;
      do {
        uVar7 = 1 << (bVar3 & 0x1f);
        switch((qk->_M_dataplus)._M_p[lVar5 + -2]) {
        case '0':
          break;
        case '1':
          uVar6 = (ulong)((uint)uVar6 | uVar7);
          break;
        case '3':
          uVar6 = (ulong)((uint)uVar6 | uVar7);
        case '2':
          uVar1 = (ulong)((uint)uVar1 | uVar7);
          break;
        default:
          puVar2 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar2 = "Unexpected quadkey digit.";
          __cxa_throw(puVar2,&char_const*::typeinfo,0);
        }
        lVar5 = lVar5 + -1;
        bVar3 = bVar3 + 1;
      } while (1 < lVar5);
      uVar1 = uVar1 << 0x20 | uVar6;
    }
  }
  TVar8.z = uVar4;
  TVar8.x = (int)uVar1;
  TVar8.y = (int)(uVar1 >> 0x20);
  return TVar8;
}

Assistant:

Tile quadkey_to_tile(const std::string &qk)
{
    int zoom = qk.length();
    if (zoom == 0)
    {
        return Tile{0,0,0};
    } 
    int xtile = 0;
    int ytile = 0;
    for (int i = zoom; i>0; i--)
    {
        int mask = 1 << (zoom-i);
        int digit = qk[i-1]-'0';
        switch (digit)
        {
            
            case 0:
                break;
            case 1:
                xtile = xtile | mask;
                break;
            case 2:
                ytile = ytile | mask;
                break;
            case 3:
                xtile = xtile | mask;
                ytile = ytile | mask;
                break;
            default:
                throw "Unexpected quadkey digit.";
                break;
        }
    }
    
    return Tile{xtile, ytile, zoom};
}